

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O2

ze_result_t
driver::zeRTASBuilderCreateExt
          (ze_driver_handle_t hDriver,ze_rtas_builder_ext_desc_t *pDescriptor,
          ze_rtas_builder_ext_handle_t *phBuilder)

{
  ze_result_t zVar1;
  
  if (DAT_0010d100 != (code *)0x0) {
    zVar1 = (*DAT_0010d100)();
    return zVar1;
  }
  context_t::get()::count = (ze_rtas_builder_ext_handle_t)((long)context_t::get()::count + 1);
  *phBuilder = context_t::get()::count;
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeRTASBuilderCreateExt(
        ze_driver_handle_t hDriver,                     ///< [in] handle of driver object
        const ze_rtas_builder_ext_desc_t* pDescriptor,  ///< [in] pointer to builder descriptor
        ze_rtas_builder_ext_handle_t* phBuilder         ///< [out] handle of builder object
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnCreateExt = context.zeDdiTable.RTASBuilder.pfnCreateExt;
        if( nullptr != pfnCreateExt )
        {
            result = pfnCreateExt( hDriver, pDescriptor, phBuilder );
        }
        else
        {
            // generic implementation
            *phBuilder = reinterpret_cast<ze_rtas_builder_ext_handle_t>( context.get() );

        }

        return result;
    }